

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v9::detail::default_arg_formatter<char>::operator()(default_arg_formatter<char> *this,handle h)

{
  iterator iVar1;
  undefined1 local_78 [8];
  context format_ctx;
  basic_string_view<char> local_50;
  undefined1 local_40 [8];
  basic_format_parse_context<char,_fmt::v9::detail::error_handler> parse_ctx;
  default_arg_formatter<char> *this_local;
  handle h_local;
  
  h_local.custom_.value = h.custom_.format;
  this_local = (default_arg_formatter<char> *)h.custom_.value;
  parse_ctx._16_8_ = this;
  basic_string_view<char>::basic_string_view(&local_50);
  basic_format_parse_context<char,_fmt::v9::detail::error_handler>::basic_format_parse_context
            ((basic_format_parse_context<char,_fmt::v9::detail::error_handler> *)local_40,
             local_50.data_,local_50.size_,0);
  basic_format_context<fmt::v9::appender,_char>::basic_format_context
            ((basic_format_context<fmt::v9::appender,_char> *)local_78,
             (appender)
             (this->out).super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
             this->args,(locale_ref)(this->loc).locale_);
  basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>::handle::format
            ((handle *)&this_local,(parse_context_type *)local_40,
             (basic_format_context<fmt::v9::appender,_char> *)local_78);
  iVar1 = basic_format_context<fmt::v9::appender,_char>::out
                    ((basic_format_context<fmt::v9::appender,_char> *)local_78);
  return (iterator)
         iVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(typename basic_format_arg<context>::handle h) -> iterator {
    basic_format_parse_context<Char> parse_ctx({});
    context format_ctx(out, args, loc);
    h.format(parse_ctx, format_ctx);
    return format_ctx.out();
  }